

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

void cft_fasttext_vocab_free(fasttext_vocab_t *vocab)

{
  size_t i;
  ulong uVar1;
  
  if (vocab != (fasttext_vocab_t *)0x0) {
    for (uVar1 = 0; uVar1 < vocab->length; uVar1 = uVar1 + 1) {
      free(vocab->words[uVar1]);
    }
    free(vocab->words);
    free(vocab->freqs);
    free(vocab);
    return;
  }
  return;
}

Assistant:

void cft_fasttext_vocab_free(fasttext_vocab_t* vocab) {
    if (vocab == nullptr) {
        return;
    }
    for (size_t i = 0; i < vocab->length; i++) {
        free(vocab->words[i]);
    }
    free(vocab->words);
    free(vocab->freqs);
    free(vocab);
}